

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

void udp_example(void)

{
  shared_ptr<spdlog::logger> my_logger;
  udp_sink_config cfg;
  udp_sink_config *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  uint16_t port;
  logger *this;
  logger *this_00;
  udp_sink_config *in_stack_ffffffffffffff40;
  undefined1 local_91;
  udp_sink_config *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  undefined1 local_49 [73];
  
  port = (uint16_t)((ulong)in_stack_ffffffffffffff30 >> 0x30);
  this_00 = (logger *)local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_49 + 1),"127.0.0.1",(allocator *)this_00);
  spdlog::sinks::udp_sink_config::udp_sink_config(in_stack_ffffffffffffff40,(string *)this_00,port);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  this = (logger *)&local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff70,"udplog",(allocator *)this);
  spdlog::sinks::udp_sink_config::udp_sink_config((udp_sink_config *)this,in_stack_ffffffffffffff28)
  ;
  spdlog::udp_logger_mt<spdlog::synchronous_factory>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  spdlog::sinks::udp_sink_config::~udp_sink_config((udp_sink_config *)0x10e335);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x10e353);
  spdlog::logger::set_level(this_00,(level_enum)((ulong)this >> 0x20));
  std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x10e36c);
  spdlog::logger::info<char[12]>(this,(char (*) [12])in_stack_ffffffffffffff28);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x10e387);
  spdlog::sinks::udp_sink_config::~udp_sink_config((udp_sink_config *)0x10e394);
  return;
}

Assistant:

void udp_example() {
    spdlog::sinks::udp_sink_config cfg("127.0.0.1", 11091);
    auto my_logger = spdlog::udp_logger_mt("udplog", cfg);
    my_logger->set_level(spdlog::level::debug);
    my_logger->info("hello world");
}